

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

string * qpdf::Name::normalize(string *__return_storage_ptr__,string *name)

{
  byte bVar1;
  size_type sVar2;
  ulong uVar3;
  undefined1 local_40;
  char cStack_3f;
  char cStack_3e;
  undefined1 uStack_3d;
  
  sVar2 = name->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (sVar2 == 0) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,(name->_M_dataplus)._M_p);
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    if (1 < name->_M_string_length) {
      uVar3 = 1;
      do {
        bVar1 = (name->_M_dataplus)._M_p[uVar3];
        if (bVar1 == 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else if ((((char)bVar1 < '!') ||
                 ((bVar1 - 0x23 < 0x3b &&
                  ((0x50000000a001065U >> ((ulong)(bVar1 - 0x23) & 0x3f) & 1) != 0)))) ||
                ((bVar1 - 0x7b < 5 && ((0x15U >> (bVar1 - 0x7b & 0x1f) & 1) != 0)))) {
          cStack_3f = "0123456789abcdef"[bVar1 >> 4];
          cStack_3e = "0123456789abcdef"[bVar1 & 0xf];
          local_40 = 0x23;
          uStack_3d = 0;
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)&local_40);
        }
        else {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < name->_M_string_length);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
Name::normalize(std::string const& name)
{
    if (name.empty()) {
        return name;
    }
    std::string result;
    result += name.at(0);
    for (size_t i = 1; i < name.length(); ++i) {
        char ch = name.at(i);
        // Don't use locale/ctype here; follow PDF spec guidelines.
        if (ch == '\0') {
            // QPDFTokenizer embeds a null character to encode an invalid #.
            result += "#";
        } else if (
            ch < 33 || ch == '#' || ch == '/' || ch == '(' || ch == ')' || ch == '{' || ch == '}' ||
            ch == '<' || ch == '>' || ch == '[' || ch == ']' || ch == '%' || ch > 126) {
            result += util::hex_encode_char(ch);
        } else {
            result += ch;
        }
    }
    return result;
}